

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cc
# Opt level: O2

void __thiscall prometheus::detail::Endpoint::~Endpoint(Endpoint *this)

{
  string *uri;
  
  uri = &this->uri_;
  CivetServer::removeHandler(this->server_,uri);
  if ((this->auth_handler_)._M_t.
      super___uniq_ptr_impl<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
      ._M_t.
      super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
      .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl !=
      (BasicAuthHandler *)0x0) {
    CivetServer::removeAuthHandler(this->server_,uri);
  }
  std::unique_ptr<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
  ::~unique_ptr(&this->auth_handler_);
  std::
  unique_ptr<prometheus::detail::MetricsHandler,_std::default_delete<prometheus::detail::MetricsHandler>_>
  ::~unique_ptr(&this->metrics_handler_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->endpoint_registry_).
              super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)uri);
  return;
}

Assistant:

Endpoint::~Endpoint() {
  server_.removeHandler(uri_);
  if (auth_handler_) {
    server_.removeAuthHandler(uri_);
  }
}